

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O1

int ptls_minicrypto_lookup_certificate_add_identity
              (ptls_minicrypto_lookup_certificate_t *self,char *server_name,
              uint16_t signature_algorithm,ptls_iovec_t key,ptls_iovec_t *certs,size_t num_certs)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  st_ptls_minicrypto_identity_t *identity;
  uint8_t *puVar5;
  size_t sVar6;
  void *__dest;
  st_ptls_minicrypto_identity_t **ppsVar7;
  uint8_t *puVar8;
  undefined6 in_register_00000012;
  int iVar9;
  size_t sVar10;
  long lVar11;
  
  puVar8 = key.base;
  bVar1 = 1;
  if (key.len == 0x20 && (int)CONCAT62(in_register_00000012,signature_algorithm) == 0x403) {
    identity = (st_ptls_minicrypto_identity_t *)malloc(num_certs * 0x10 + 0x38);
    iVar9 = 0x201;
    if (identity != (st_ptls_minicrypto_identity_t *)0x0) {
      identity->num_certs = 0;
      identity->certs[0].base = (uint8_t *)0x0;
      identity->key[0x10] = '\0';
      identity->key[0x11] = '\0';
      identity->key[0x12] = '\0';
      identity->key[0x13] = '\0';
      identity->key[0x14] = '\0';
      identity->key[0x15] = '\0';
      identity->key[0x16] = '\0';
      identity->key[0x17] = '\0';
      identity->key[0x18] = '\0';
      identity->key[0x19] = '\0';
      identity->key[0x1a] = '\0';
      identity->key[0x1b] = '\0';
      identity->key[0x1c] = '\0';
      identity->key[0x1d] = '\0';
      identity->key[0x1e] = '\0';
      identity->key[0x1f] = '\0';
      identity->key[0] = '\0';
      identity->key[1] = '\0';
      identity->key[2] = '\0';
      identity->key[3] = '\0';
      identity->key[4] = '\0';
      identity->key[5] = '\0';
      identity->key[6] = '\0';
      identity->key[7] = '\0';
      identity->key[8] = '\0';
      identity->key[9] = '\0';
      identity->key[10] = '\0';
      identity->key[0xb] = '\0';
      identity->key[0xc] = '\0';
      identity->key[0xd] = '\0';
      identity->key[0xe] = '\0';
      identity->key[0xf] = '\0';
      (identity->name).base = (uint8_t *)0x0;
      (identity->name).len = 0;
      identity->certs[0].len = 0;
      puVar5 = (uint8_t *)strdup(server_name);
      (identity->name).base = puVar5;
      if (puVar5 != (uint8_t *)0x0) {
        sVar6 = strlen(server_name);
        (identity->name).len = sVar6;
        uVar2 = *(undefined8 *)(puVar8 + 8);
        uVar3 = *(undefined8 *)(puVar8 + 0x10);
        uVar4 = *(undefined8 *)(puVar8 + 0x18);
        *(undefined8 *)identity->key = *(undefined8 *)puVar8;
        *(undefined8 *)(identity->key + 8) = uVar2;
        *(undefined8 *)(identity->key + 0x10) = uVar3;
        *(undefined8 *)(identity->key + 0x18) = uVar4;
        sVar10 = identity->num_certs;
        if (sVar10 != num_certs) {
          lVar11 = sVar10 << 4;
          do {
            sVar10 = sVar10 + 1;
            sVar6 = *(size_t *)((long)&certs->len + lVar11);
            __dest = malloc(sVar6);
            *(void **)((long)&identity->certs[0].base + lVar11) = __dest;
            if (__dest == (void *)0x0) {
              iVar9 = 0x201;
              goto LAB_00113730;
            }
            memcpy(__dest,*(void **)((long)&certs->base + lVar11),
                   *(size_t *)((long)&certs->len + lVar11));
            *(size_t *)((long)&identity->certs[0].len + lVar11) = sVar6;
            identity->num_certs = sVar10;
            lVar11 = lVar11 + 0x10;
          } while (sVar10 != num_certs);
        }
        ppsVar7 = (st_ptls_minicrypto_identity_t **)realloc(self->identities,self->count * 8 + 8);
        iVar9 = 0x201;
        if (ppsVar7 != (st_ptls_minicrypto_identity_t **)0x0) {
          self->identities = ppsVar7;
          sVar10 = self->count;
          self->count = sVar10 + 1;
          ppsVar7[sVar10] = identity;
          bVar1 = 0;
          iVar9 = 0;
        }
      }
      goto LAB_00113730;
    }
  }
  else {
    iVar9 = 0x204;
  }
  identity = (st_ptls_minicrypto_identity_t *)0x0;
LAB_00113730:
  if (!(bool)(bVar1 ^ 1 | identity == (st_ptls_minicrypto_identity_t *)0x0)) {
    free_identity(identity);
  }
  return iVar9;
}

Assistant:

int ptls_minicrypto_lookup_certificate_add_identity(ptls_minicrypto_lookup_certificate_t *self, const char *server_name,
                                                    uint16_t signature_algorithm, ptls_iovec_t key, ptls_iovec_t *certs,
                                                    size_t num_certs)
{
    struct st_ptls_minicrypto_identity_t *identity = NULL, **list;
    int ret;

    /* check args */
    if (!(signature_algorithm == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256 && key.len == sizeof(identity->key))) {
        ret = PTLS_ERROR_INCOMPATIBLE_KEY;
        goto Exit;
    }

    /* create new identity object */
    if ((identity = (struct st_ptls_minicrypto_identity_t *)malloc(offsetof(struct st_ptls_minicrypto_identity_t, certs) +
                                                                   sizeof(identity->certs[0]) * num_certs)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *identity = (struct st_ptls_minicrypto_identity_t){{NULL}};
    if ((identity->name.base = (uint8_t *)strdup(server_name)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    identity->name.len = strlen(server_name);
    memcpy(identity->key, key.base, key.len);
    for (; identity->num_certs != num_certs; ++identity->num_certs) {
        if ((identity->certs[identity->num_certs].base = (uint8_t *)malloc(certs[identity->num_certs].len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        memcpy(identity->certs[identity->num_certs].base, certs[identity->num_certs].base, certs[identity->num_certs].len);
        identity->certs[identity->num_certs].len = certs[identity->num_certs].len;
    }

    /* add to the list */
    if ((list = realloc(self->identities, sizeof(self->identities[0]) * (self->count + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    self->identities = list;
    self->identities[self->count++] = identity;

    ret = 0;
Exit:
    if (ret != 0 && identity != NULL)
        free_identity(identity);
    return ret;
}